

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O3

void __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::WriteColumnSizes
          (NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_> *this)

{
  ColSizeWriter csw;
  ColSizeWriter local_28;
  
  TextFormatter::apr(&this->super_FormatterType,&this->nm,
                     "k%d\t#intermediate Jacobian column lengths (cumulative)\n",
                     (ulong)(((this->header_).super_NLProblemInfo.super_NLProblemInfo_C.
                              num_rand_vars +
                             (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_vars) - 1
                            ));
  local_28.kind_ = 1;
  local_28.sum_ = 0;
  local_28.nWrt_ = 0;
  local_28.nlw_ = this;
  ColSizeWriter::Write(&local_28,this->feeder_->mdl_->col_sizes[0]);
  return;
}

Assistant:

void NLWriter2<Params>::WriteColumnSizes() {
  switch(Feeder().WantColumnSizes()) {
  case 1:
    apr(nm,
		#ifdef NL_LIB2_ORIG_HDR
				"k%d\t#intermediate Jacobian column lengths\n",
		#else
				"k%d\t#intermediate Jacobian column lengths (cumulative)\n",
		#endif
        Hdr().num_vars + Hdr().num_rand_vars - 1);
  {
    ColSizeWriter csw(*this, 1);
    Feeder().FeedColumnSizes(csw);
    assert(Hdr().num_vars + Hdr().num_rand_vars - 1
           == csw.GetNWritten());
  }
    break;
  case 2:
    apr(nm, "K%d\t#intermediate Jacobian column lengths\n",
        Hdr().num_vars + Hdr().num_rand_vars - 1);
  {
    ColSizeWriter csw(*this, 2);
    Feeder().FeedColumnSizes(csw);
    assert(Hdr().num_vars + Hdr().num_rand_vars - 1
           == csw.GetNWritten());
  }
    break;
  case 0:
    break;            // SKIP
  default:
    assert(0 && "why am I here?");
  }
}